

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkaccessmanager.cpp
# Opt level: O3

void QNetworkAccessManager::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  undefined8 *puVar3;
  InterfaceType *pIVar4;
  int iVar5;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 4:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 1) {
LAB_00181ba6:
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
LAB_00181bd0:
        *puVar3 = pIVar4;
        goto switchD_00181ad2_default;
      }
      break;
    case 5:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 1) {
LAB_00181bc9:
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
        goto LAB_00181bd0;
      }
      break;
    default:
      puVar3 = (undefined8 *)*_a;
      break;
    case 7:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) goto LAB_00181ba6;
      break;
    case 8:
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 0) goto LAB_00181bc9;
    }
    *puVar3 = 0;
    goto switchD_00181ad2_default;
  }
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == proxyAuthenticationRequired && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == authenticationRequired && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == finished && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar1 == encrypted && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar1 == sslErrors && lVar2 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar1 == preSharedKeyAuthenticationRequired && lVar2 == 0) {
      *(undefined4 *)*_a = 5;
    }
    goto switchD_00181ad2_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_00181ad2_default;
  switch(_id) {
  case 0:
    puStack_20 = (undefined1 *)_a[1];
    local_30 = *_a[2];
    local_18 = (undefined1 *)&local_30;
    iVar5 = 0;
    break;
  case 1:
    local_30 = *_a[1];
    local_38 = *_a[2];
    puStack_20 = (undefined1 *)&local_30;
    iVar5 = 1;
    local_18 = (undefined1 *)&local_38;
    break;
  case 2:
    local_30 = *_a[1];
    puStack_20 = (undefined1 *)&local_30;
    iVar5 = 2;
    break;
  case 3:
    local_30 = *_a[1];
    puStack_20 = (undefined1 *)&local_30;
    iVar5 = 3;
    break;
  case 4:
    local_30 = *_a[1];
    puStack_20 = (undefined1 *)&local_30;
    iVar5 = 4;
    local_18 = (undefined1 *)_a[2];
    break;
  case 5:
    local_30 = *_a[1];
    local_38 = *_a[2];
    puStack_20 = (undefined1 *)&local_30;
    iVar5 = 5;
    local_18 = (undefined1 *)&local_38;
    break;
  case 6:
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    supportedSchemesImplementation((QStringList *)&local_28,(QNetworkAccessManager *)_o);
    if ((QArrayDataPointer<QString> *)*_a != (QArrayDataPointer<QString> *)0x0) {
      QArrayDataPointer<QString>::operator=
                ((QArrayDataPointer<QString> *)*_a,(QArrayDataPointer<QString> *)&local_28);
    }
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_28);
    goto switchD_00181ad2_default;
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QNetworkAccessManagerPrivate::_q_replySslErrors
                (*(QNetworkAccessManagerPrivate **)(_o + 8),(QList<QSslError> *)_a[1]);
      return;
    }
    goto LAB_00181e11;
  case 8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QNetworkAccessManagerPrivate::_q_replyPreSharedKeyAuthenticationRequired
                (*(QNetworkAccessManagerPrivate **)(_o + 8),*_a[1]);
      return;
    }
    goto LAB_00181e11;
  default:
    goto switchD_00181ad2_default;
  }
  local_28 = (undefined1 *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_28);
switchD_00181ad2_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_00181e11:
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessManager::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkAccessManager *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 1: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 2: _t->finished((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1]))); break;
        case 3: _t->encrypted((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1]))); break;
        case 4: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[2]))); break;
        case 5: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkReply*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[2]))); break;
        case 6: { QStringList _r = _t->supportedSchemesImplementation();
            if (_a[0]) *reinterpret_cast< QStringList*>(_a[0]) = std::move(_r); }  break;
        case 7: _t->d_func()->_q_replySslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 8: _t->d_func()->_q_replyPreSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(const QNetworkProxy & , QAuthenticator * )>(_a, &QNetworkAccessManager::proxyAuthenticationRequired, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * , QAuthenticator * )>(_a, &QNetworkAccessManager::authenticationRequired, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * )>(_a, &QNetworkAccessManager::finished, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * )>(_a, &QNetworkAccessManager::encrypted, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * , const QList<QSslError> & )>(_a, &QNetworkAccessManager::sslErrors, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkAccessManager::*)(QNetworkReply * , QSslPreSharedKeyAuthenticator * )>(_a, &QNetworkAccessManager::preSharedKeyAuthenticationRequired, 5))
            return;
    }
}